

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  cmLocalNinjaGenerator *this_01;
  bool bVar2;
  Value *pVVar3;
  char *pcVar4;
  string *config;
  pointer pbVar5;
  string tdin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  Value tdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked;
  Value local_3e0;
  Value local_3b8;
  Value local_390;
  Value local_368;
  Value local_340;
  Value local_318;
  Value local_2f0;
  Value local_2c8;
  Value local_2a0;
  cmGeneratedFileStream tdif;
  
  Json::Value::Value(&tdi,objectValue);
  Json::Value::Value(&local_2a0,lang);
  pVVar3 = Json::Value::operator[](&tdi,"language");
  Json::Value::operator=(pVVar3,&local_2a0);
  Json::Value::~Value(&local_2a0);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::operator+(&tdin,"CMAKE_",lang);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tdif,&tdin,
                 "_COMPILER_ID");
  pcVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)&tdif);
  Json::Value::Value(&local_2c8,pcVar4);
  pVVar3 = Json::Value::operator[](&tdi,"compiler-id");
  Json::Value::operator=(pVVar3,&local_2c8);
  Json::Value::~Value(&local_2c8);
  std::__cxx11::string::~string((string *)&tdif);
  std::__cxx11::string::~string((string *)&tdin);
  bVar2 = std::operator==(lang,"Fortran");
  if (bVar2) {
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    pcVar4 = cmMakefile::GetHomeOutputDirectory((this->super_cmCommonTargetGenerator).Makefile);
    std::__cxx11::string::string((string *)&tdin,pcVar4,(allocator *)&includes);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)&tdif,pcVar1,&tdin);
    std::__cxx11::string::~string((string *)&tdin);
    if (tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ == 0) {
      cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommonTargetGenerator).Makefile);
      std::__cxx11::string::assign((char *)&tdif);
    }
    Json::Value::Value(&local_2f0,(string *)&tdif);
    pVVar3 = Json::Value::operator[](&tdi,"module-dir");
    Json::Value::operator=(pVVar3,&local_2f0);
    Json::Value::~Value(&local_2f0);
    std::__cxx11::string::~string((string *)&tdif);
  }
  pcVar4 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_318,pcVar4);
  pVVar3 = Json::Value::operator[](&tdi,"dir-cur-bld");
  Json::Value::operator=(pVVar3,&local_318);
  Json::Value::~Value(&local_318);
  pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_340,pcVar4);
  pVVar3 = Json::Value::operator[](&tdi,"dir-cur-src");
  Json::Value::operator=(pVVar3,&local_340);
  Json::Value::~Value(&local_340);
  pcVar4 = cmMakefile::GetHomeOutputDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_368,pcVar4);
  pVVar3 = Json::Value::operator[](&tdi,"dir-top-bld");
  Json::Value::operator=(pVVar3,&local_368);
  Json::Value::~Value(&local_368);
  pcVar4 = cmMakefile::GetHomeDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_390,pcVar4);
  pVVar3 = Json::Value::operator[](&tdi,"dir-top-src");
  Json::Value::operator=(pVVar3,&local_390);
  Json::Value::~Value(&local_390);
  Json::Value::Value(&local_3b8,arrayValue);
  pVVar3 = Json::Value::operator[](&tdi,"include-dirs");
  pVVar3 = Json::Value::operator=(pVVar3,&local_3b8);
  Json::Value::~Value(&local_3b8);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_01 = this->LocalGenerator;
  config = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this_01,&includes,pcVar1,lang,config,true);
  for (pbVar5 = includes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 != includes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
    ConvertToNinjaPath(&tdin,this,pbVar5);
    Json::Value::Value((Value *)&tdif,&tdin);
    Json::Value::append(pVVar3,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
    std::__cxx11::string::~string((string *)&tdin);
  }
  Json::Value::Value(&local_3e0,arrayValue);
  pVVar3 = Json::Value::operator[](&tdi,"linked-target-dirs");
  pVVar3 = Json::Value::operator=(pVVar3,&local_3e0);
  Json::Value::~Value(&local_3e0);
  cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
            (&linked,&this->super_cmCommonTargetGenerator);
  for (pbVar5 = linked.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 != linked.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
    Json::Value::Value((Value *)&tdif,pbVar5);
    Json::Value::append(pVVar3,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
  }
  GetTargetDependInfoPath(&tdin,this,lang);
  cmGeneratedFileStream::cmGeneratedFileStream(&tdif,tdin._M_dataplus._M_p,false,None);
  Json::operator<<((ostream *)&tdif,&tdi);
  cmGeneratedFileStream::~cmGeneratedFileStream(&tdif);
  std::__cxx11::string::~string((string *)&tdin);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&linked);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  Json::Value::~Value(&tdi);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] =
    this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID");

  if (lang == "Fortran") {
    std::string mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
    if (mod_dir.empty()) {
      mod_dir = this->Makefile->GetCurrentBinaryDirectory();
    }
    tdi["module-dir"] = mod_dir;
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, this->GetConfigName());
  for (std::vector<std::string>::iterator i = includes.begin();
       i != includes.end(); ++i) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(*i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  std::vector<std::string> linked = this->GetLinkedTargetDirectories();
  for (std::vector<std::string>::iterator i = linked.begin();
       i != linked.end(); ++i) {
    tdi_linked_target_dirs.append(*i);
  }

  std::string const tdin = this->GetTargetDependInfoPath(lang);
  cmGeneratedFileStream tdif(tdin.c_str());
  tdif << tdi;
}